

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatterTest_AutoArgIndex_Test::TestBody(FormatterTest_AutoArgIndex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  AssertionResult gtest_ar_3;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar;
  AssertionResult local_3d8;
  undefined1 local_3c8 [16];
  AssertHelper local_3b8 [2];
  undefined1 local_3a8 [32];
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [2];
  AssertionResult local_358;
  AssertionResult local_348;
  undefined8 local_338;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  undefined8 local_328;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  undefined1 *local_308;
  long local_300;
  undefined8 local_2f8;
  undefined1 local_2f0 [504];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined8 local_58 [2];
  undefined8 local_48;
  
  local_3b8[0].data_ = (AssertHelperData *)&DAT_00000061;
  local_3a8._0_8_ = 0x62;
  local_3a8._16_8_ = 99;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str.size_ = 6;
  format_str.data_ = "{}{}{}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_3b8;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char,char,char>
                ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str,args,(locale_ref)0x0);
  local_388._0_8_ = local_378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_338,"\"abc\"","format(\"{}{}{}\", \'a\', \'b\', \'c\')",
             (char (*) [4])0x238079,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._0_8_ != local_378) {
    operator_delete((void *)local_388._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_330.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x343,pcVar2);
    testing::internal::AssertHelper::operator=(local_3b8,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper(local_3b8);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_388[0] == (string)0x1) {
    local_3b8[0].data_ = (AssertHelperData *)local_3a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,"cannot switch from manual to automatic argument indexing","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_58[0] = 0x61;
      local_48 = 0x62;
      local_300 = 0;
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2f8 = 500;
      format_str_00.size_ = 5;
      format_str_00.data_ = "{0}{}";
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_58;
      args_00.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char,char>
           ::TYPES;
      local_308 = local_2f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_310,format_str_00,args_00,(locale_ref)0x0);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,local_308,local_308 + local_300);
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_308 != local_2f0) {
        operator_delete(local_308);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)local_388,
               (char (*) [107])
               "Expected: format(\"{0}{}\", \'a\', \'b\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_3b8[0].data_ != (AssertHelperData *)local_3a8) {
      operator_delete(local_3b8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_310);
  if ((undefined8 *)local_388._8_8_ == (undefined8 *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = *(char **)local_388._8_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_3b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x345,pcVar2);
  testing::internal::AssertHelper::operator=(local_3b8,(Message *)&local_310);
  testing::internal::AssertHelper::~AssertHelper(local_3b8);
  if (((local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_310.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_310.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_388 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  testing::AssertionSuccess();
  if (local_388[0] == (string)0x1) {
    local_3b8[0].data_ = (AssertHelperData *)local_3a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,"cannot switch from automatic to manual argument indexing","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338 = 0x61;
      local_328 = 0x62;
      local_300 = 0;
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2f8 = 500;
      format_str_01.size_ = 5;
      format_str_01.data_ = "{}{0}";
      args_01.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_338;
      args_01.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char,char>
           ::TYPES;
      local_308 = local_2f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_310,format_str_01,args_01,(locale_ref)0x0);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,local_308,local_308 + local_300);
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_308 != local_2f0) {
        operator_delete(local_308);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)local_388,
               (char (*) [107])
               "Expected: format(\"{}{0}\", \'a\', \'b\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_3b8[0].data_ != (AssertHelperData *)local_3a8) {
      operator_delete(local_3b8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_310);
  if ((undefined8 *)local_388._8_8_ == (undefined8 *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = *(char **)local_388._8_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_3b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x347,pcVar2);
  testing::internal::AssertHelper::operator=(local_3b8,(Message *)&local_310);
  testing::internal::AssertHelper::~AssertHelper(local_3b8);
  if (((local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_310.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_310.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_388 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_3b8[0].data_ = (AssertHelperData *)0x3ff3c083126e978d;
  local_3a8._0_8_ = 2;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_02.size_ = 6;
  format_str_02.data_ = "{:.{}}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_3b8;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double,int>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_02,args_02,(locale_ref)0x0);
  local_388._0_8_ = local_378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_3d8,"\"1.2\"","format(\"{:.{}}\", 1.2345, 2)",(char (*) [4])0x2428ed
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._0_8_ != local_378) {
    operator_delete((void *)local_388._0_8_);
  }
  if ((internal)local_3d8.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_3d8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_3d8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x348,pcVar2);
    testing::internal::AssertHelper::operator=(local_3b8,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper(local_3b8);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((internal)local_3d8.success_ == (internal)0x1) {
    local_3b8[0].data_ = (AssertHelperData *)local_3a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,"cannot switch from manual to automatic argument indexing","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_388._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x3ff3c083126e978d;
      local_378[0]._M_allocated_capacity = 2;
      local_300 = 0;
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2f8 = 500;
      format_str_03.size_ = 7;
      format_str_03.data_ = "{0}:.{}";
      args_03.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_388;
      args_03.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double,int>
           ::TYPES;
      local_308 = local_2f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_310,format_str_03,args_03,(locale_ref)0x0);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,local_308,local_308 + local_300);
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_308 != local_2f0) {
        operator_delete(local_308);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_3d8,
               (char (*) [110])
               "Expected: format(\"{0}:.{}\", 1.2345, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_3b8[0].data_ != (AssertHelperData *)local_3a8) {
      operator_delete(local_3b8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_310);
  if (local_3d8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_3d8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_3b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x34a,pcVar2);
  testing::internal::AssertHelper::operator=(local_3b8,(Message *)&local_310);
  testing::internal::AssertHelper::~AssertHelper(local_3b8);
  if (((local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_310.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_310.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_358.success_ == true) {
    local_3d8._0_8_ = (AssertHelperData *)local_3c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3d8,"cannot switch from automatic to manual argument indexing","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_3b8[0].data_ = (AssertHelperData *)0x3ff3c083126e978d;
      local_3a8._0_8_ = 2;
      local_300 = 0;
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2f8 = 500;
      format_str_04.size_ = 7;
      format_str_04.data_ = "{:.{0}}";
      args_04.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_3b8;
      args_04.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double,int>
           ::TYPES;
      local_308 = local_2f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_310,format_str_04,args_04,(locale_ref)0x0);
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,local_308,local_308 + local_300);
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_308 != local_2f0) {
        operator_delete(local_308);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_358,
               (char (*) [110])
               "Expected: format(\"{:.{0}}\", 1.2345, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_3d8._0_8_ != (AssertHelperData *)local_3c8) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_310);
  if (local_358.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_358.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x34c,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,(Message *)&local_310);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
  if (((local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_310.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_310.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_358.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_348.success_ == true) {
    local_3d8._0_8_ = (AssertHelperData *)local_3c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3d8,"argument index out of range","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_358.success_ = false;
      local_358._1_3_ = 0;
      local_300 = 0;
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2f8 = 500;
      format_str_05.size_ = 2;
      format_str_05.data_ = "{}";
      args_05.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_358;
      args_05.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_308 = local_2f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_310,format_str_05,args_05,(locale_ref)0x0);
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,local_308,local_308 + local_300);
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_308 != local_2f0) {
        operator_delete(local_308);
      }
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_348,
               (char (*) [94])
               "Expected: format(\"{}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_3d8._0_8_ != (AssertHelperData *)local_3c8) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_310);
  if (local_348.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_348.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x34d,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,(Message *)&local_310);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
  if (((local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_310.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_310.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_348.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(FormatterTest, AutoArgIndex) {
  EXPECT_EQ("abc", format("{}{}{}", 'a', 'b', 'c'));
  EXPECT_THROW_MSG(format("{0}{}", 'a', 'b'),
      format_error, "cannot switch from manual to automatic argument indexing");
  EXPECT_THROW_MSG(format("{}{0}", 'a', 'b'),
      format_error, "cannot switch from automatic to manual argument indexing");
  EXPECT_EQ("1.2", format("{:.{}}", 1.2345, 2));
  EXPECT_THROW_MSG(format("{0}:.{}", 1.2345, 2),
      format_error, "cannot switch from manual to automatic argument indexing");
  EXPECT_THROW_MSG(format("{:.{0}}", 1.2345, 2),
      format_error, "cannot switch from automatic to manual argument indexing");
  EXPECT_THROW_MSG(format("{}"), format_error, "argument index out of range");
}